

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O2

GetblockResponse * __thiscall
Future<GetblockResponse>::get
          (GetblockResponse *__return_storage_ptr__,Future<GetblockResponse> *this)

{
  element_type *peVar1;
  GetblockResponse local_70;
  
  if ((this->is_done_ == false) &&
     (peVar1 = (this->task_).
               super___shared_ptr<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    (**peVar1->_vptr_AsyncTask)(&local_70);
    GetblockResponse::operator=(&this->result_,&local_70);
    GetblockResponse::~GetblockResponse(&local_70);
    this->is_done_ = true;
  }
  GetblockResponse::GetblockResponse(__return_storage_ptr__,&this->result_);
  return __return_storage_ptr__;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }